

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O2

ostream * el::base::debug::operator<<(ostream *ss,StackTraceEntry *si)

{
  ostream *poVar1;
  char *pcVar2;
  
  poVar1 = std::operator<<((ostream *)ss,"[");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"] ");
  poVar1 = std::operator<<(poVar1,(string *)&si->m_location);
  pcVar2 = ":";
  if ((si->m_demangled)._M_string_length == 0) {
    pcVar2 = "";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1,(string *)&si->m_demangled);
  pcVar2 = "+";
  if ((si->m_hex)._M_string_length == 0) {
    pcVar2 = "";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1,(string *)&si->m_hex);
  std::operator<<(poVar1,(string *)&si->m_addr);
  return ss;
}

Assistant:

std::ostream& operator<<(std::ostream& ss, const StackTrace::StackTraceEntry& si) {
  ss << "[" << si.m_index << "] " << si.m_location << (si.m_demangled.empty() ? "" : ":") << si.m_demangled
     << (si.m_hex.empty() ? "" : "+") << si.m_hex << si.m_addr;
  return ss;
}